

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O3

int __thiscall
ncnn::UnaryOp_x86::forward_inplace(UnaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  undefined1 (*pauVar7) [16];
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar26;
  float fVar27;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar28;
  uint uVar29;
  float fVar30;
  uint uVar31;
  uint uVar32;
  undefined1 auVar25 [16];
  float fVar40;
  float fVar41;
  undefined1 auVar33 [16];
  float fVar42;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar59;
  undefined1 auVar56 [16];
  float fVar61;
  undefined1 auVar57 [16];
  float fVar60;
  float fVar62;
  undefined1 auVar58 [16];
  float fVar63;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 in_XMM5 [16];
  float fVar68;
  undefined1 auVar64 [16];
  float fVar69;
  __m128 afVar70;
  unary_op_tan op;
  uint local_60;
  unary_op_tan local_51;
  long local_50;
  float local_48 [2];
  float afStack_40 [4];
  undefined8 extraout_XMM0_Qb;
  
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86[-3])) {
  case 0:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            auVar33._0_8_ = *(ulong *)*pauVar7 & 0x7fffffff7fffffff;
            auVar33._8_4_ = *(uint *)((long)*pauVar7 + 8) & 0x7fffffff;
            auVar33._12_4_ = *(uint *)((long)*pauVar7 + 0xc) & 0x7fffffff;
            *pauVar7 = auVar33;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            *(uint *)((long)*pauVar7 + lVar8 * 4) =
                 *(uint *)((long)*pauVar7 + lVar8 * 4) & 0x7fffffff;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 1:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            auVar37._0_8_ = *(ulong *)*pauVar7 ^ 0x8000000080000000;
            auVar37._8_4_ = *(uint *)((long)*pauVar7 + 8) ^ 0x80000000;
            auVar37._12_4_ = *(uint *)((long)*pauVar7 + 0xc) ^ 0x80000000;
            *pauVar7 = auVar37;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            *(uint *)((long)*pauVar7 + lVar8 * 4) =
                 *(uint *)((long)*pauVar7 + lVar8 * 4) ^ 0x80000000;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 2:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_60 = uVar5 & 0xfffffffc;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            auVar54 = *pauVar7;
            fVar14 = auVar54._0_4_;
            fVar13 = auVar54._4_4_;
            fVar40 = auVar54._8_4_;
            fVar26 = auVar54._12_4_;
            uVar9 = -(uint)(ABS(fVar14) <= 8388608.0);
            uVar10 = -(uint)(ABS(fVar13) <= 8388608.0);
            uVar11 = -(uint)(ABS(fVar40) <= 8388608.0);
            uVar12 = -(uint)(ABS(fVar26) <= 8388608.0);
            fVar41 = (float)((uint)(float)(int)ABS(fVar14) | (uint)fVar14 & 0x80000000);
            fVar27 = (float)((uint)(float)(int)ABS(fVar13) | (uint)fVar13 & 0x80000000);
            fVar42 = (float)((uint)(float)(int)ABS(fVar40) | (uint)fVar40 & 0x80000000);
            fVar30 = (float)((uint)(float)(int)ABS(fVar26) | (uint)fVar26 & 0x80000000);
            auVar51._0_4_ = (uint)(fVar41 - (float)(-(uint)(fVar14 < fVar41) & 0x3f800000)) & uVar9;
            auVar51._4_4_ = (uint)(fVar27 - (float)(-(uint)(fVar13 < fVar27) & 0x3f800000)) & uVar10
            ;
            auVar51._8_4_ = (uint)(fVar42 - (float)(-(uint)(fVar40 < fVar42) & 0x3f800000)) & uVar11
            ;
            auVar51._12_4_ =
                 (uint)(fVar30 - (float)(-(uint)(fVar26 < fVar30) & 0x3f800000)) & uVar12;
            auVar35._0_4_ = ~uVar9 & (uint)fVar14;
            auVar35._4_4_ = ~uVar10 & (uint)fVar13;
            auVar35._8_4_ = ~uVar11 & (uint)fVar40;
            auVar35._12_4_ = ~uVar12 & (uint)fVar26;
            *pauVar7 = auVar35 | auVar51;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = local_60;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            fVar14 = floorf(*(float *)(*pauVar7 + lVar8 * 4));
            *(float *)(*pauVar7 + lVar8 * 4) = fVar14;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 3:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_60 = uVar5 & 0xfffffffc;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            auVar54 = *pauVar7;
            fVar14 = auVar54._0_4_;
            fVar13 = auVar54._4_4_;
            fVar40 = auVar54._8_4_;
            fVar26 = auVar54._12_4_;
            uVar9 = -(uint)(ABS(fVar14) <= 8388608.0);
            uVar10 = -(uint)(ABS(fVar13) <= 8388608.0);
            uVar11 = -(uint)(ABS(fVar40) <= 8388608.0);
            uVar12 = -(uint)(ABS(fVar26) <= 8388608.0);
            fVar41 = (float)((uint)(float)(int)ABS(fVar14) | (uint)fVar14 & 0x80000000);
            fVar27 = (float)((uint)(float)(int)ABS(fVar13) | (uint)fVar13 & 0x80000000);
            fVar42 = (float)((uint)(float)(int)ABS(fVar40) | (uint)fVar40 & 0x80000000);
            fVar30 = (float)((uint)(float)(int)ABS(fVar26) | (uint)fVar26 & 0x80000000);
            auVar52._0_4_ =
                 (uint)(fVar41 - (float)(-(uint)(fVar41 < fVar14 && 0.0 < fVar14) & 0xbf800000)) &
                 uVar9;
            auVar52._4_4_ =
                 (uint)(fVar27 - (float)(-(uint)(fVar27 < fVar13 && 0.0 < fVar13) & 0xbf800000)) &
                 uVar10;
            auVar52._8_4_ =
                 (uint)(fVar42 - (float)(-(uint)(fVar42 < fVar40 && 0.0 < fVar40) & 0xbf800000)) &
                 uVar11;
            auVar52._12_4_ =
                 (uint)(fVar30 - (float)(-(uint)(fVar30 < fVar26 && 0.0 < fVar26) & 0xbf800000)) &
                 uVar12;
            auVar36._0_4_ = ~uVar9 & (uint)fVar14;
            auVar36._4_4_ = ~uVar10 & (uint)fVar13;
            auVar36._8_4_ = ~uVar11 & (uint)fVar40;
            auVar36._12_4_ = ~uVar12 & (uint)fVar26;
            *pauVar7 = auVar36 | auVar52;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = local_60;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            fVar14 = ceilf(*(float *)(*pauVar7 + lVar8 * 4));
            *(float *)(*pauVar7 + lVar8 * 4) = fVar14;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 4:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            fVar14 = *(float *)((long)*pauVar7 + 4);
            fVar13 = *(float *)((long)*pauVar7 + 8);
            fVar40 = *(float *)((long)*pauVar7 + 0xc);
            auVar20._0_4_ = *(float *)*pauVar7 * *(float *)*pauVar7;
            auVar20._4_4_ = fVar14 * fVar14;
            auVar20._8_4_ = fVar13 * fVar13;
            auVar20._12_4_ = fVar40 * fVar40;
            *pauVar7 = auVar20;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            fVar14 = *(float *)((long)*pauVar7 + lVar8 * 4);
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar14 * fVar14;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 5:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            auVar54 = *pauVar7;
            auVar24 = rsqrtps(in_XMM5,auVar54);
            fVar14 = auVar54._0_4_ * auVar24._0_4_;
            fVar13 = auVar54._4_4_ * auVar24._4_4_;
            fVar40 = auVar54._8_4_ * auVar24._8_4_;
            fVar26 = auVar54._12_4_ * auVar24._12_4_;
            in_XMM5._0_4_ =
                 -(uint)(1.1754944e-38 <= ABS(auVar54._0_4_)) &
                 (uint)((fVar14 * auVar24._0_4_ + -3.0) * fVar14 * -0.5);
            in_XMM5._4_4_ =
                 -(uint)(1.1754944e-38 <= ABS(auVar54._4_4_)) &
                 (uint)((fVar13 * auVar24._4_4_ + -3.0) * fVar13 * -0.5);
            in_XMM5._8_4_ =
                 -(uint)(1.1754944e-38 <= ABS(auVar54._8_4_)) &
                 (uint)((fVar40 * auVar24._8_4_ + -3.0) * fVar40 * -0.5);
            in_XMM5._12_4_ =
                 -(uint)(1.1754944e-38 <= ABS(auVar54._12_4_)) &
                 (uint)((fVar26 * auVar24._12_4_ + -3.0) * fVar26 * -0.5);
            *pauVar7 = in_XMM5;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            *(float *)(*pauVar7 + lVar8 * 4) = SQRT(*(float *)(*pauVar7 + lVar8 * 4));
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 6:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            in_XMM2 = rsqrtps(in_XMM2,*pauVar7);
            *pauVar7 = in_XMM2;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            auVar54 = rsqrtss(ZEXT816(0),ZEXT416((uint)*(float *)(*pauVar7 + lVar8 * 4)));
            fVar13 = auVar54._0_4_;
            fVar14 = *(float *)(*pauVar7 + lVar8 * 4) * fVar13 * fVar13 + -3.0;
            in_XMM2 = ZEXT416((uint)fVar14);
            *(float *)(*pauVar7 + lVar8 * 4) = fVar13 * -0.5 * fVar14;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 7:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_60 = uVar5 & 0xfffffffc;
      lVar6 = 0;
      do {
        auVar24 = _DAT_005552b0;
        auVar54 = _DAT_005552a0;
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            auVar16 = minps(*pauVar7,auVar54);
            auVar16 = maxps(auVar16,auVar24);
            fVar13 = auVar16._0_4_ * 1.442695 + 0.5;
            fVar26 = auVar16._4_4_ * 1.442695 + 0.5;
            fVar27 = auVar16._8_4_ * 1.442695 + 0.5;
            fVar30 = auVar16._12_4_ * 1.442695 + 0.5;
            fVar14 = (float)(int)fVar13;
            fVar40 = (float)(int)fVar26;
            fVar41 = (float)(int)fVar27;
            fVar42 = (float)(int)fVar30;
            fVar14 = fVar14 - (float)(-(uint)(fVar13 < fVar14) & 0x3f800000);
            fVar40 = fVar40 - (float)(-(uint)(fVar26 < fVar40) & 0x3f800000);
            fVar41 = fVar41 - (float)(-(uint)(fVar27 < fVar41) & 0x3f800000);
            fVar42 = fVar42 - (float)(-(uint)(fVar30 < fVar42) & 0x3f800000);
            fVar13 = fVar14 * -0.6931472 + auVar16._0_4_;
            fVar26 = fVar40 * -0.6931472 + auVar16._4_4_;
            fVar27 = fVar41 * -0.6931472 + auVar16._8_4_;
            fVar30 = fVar42 * -0.6931472 + auVar16._12_4_;
            auVar45._0_4_ =
                 (float)((int)fVar14 * 0x800000 + 0x3f800000) *
                 (fVar13 + 1.0 +
                 (((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) * fVar13 +
                   0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5) * fVar13 * fVar13);
            auVar45._4_4_ =
                 (float)((int)fVar40 * 0x800000 + 0x3f800000) *
                 (fVar26 + 1.0 +
                 (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                   0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5) * fVar26 * fVar26);
            auVar45._8_4_ =
                 (float)((int)fVar41 * 0x800000 + 0x3f800000) *
                 (fVar27 + 1.0 +
                 (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                   0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5) * fVar27 * fVar27);
            auVar45._12_4_ =
                 (float)((int)fVar42 * 0x800000 + 0x3f800000) *
                 (fVar30 + 1.0 +
                 (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
                   0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5) * fVar30 * fVar30);
            *pauVar7 = auVar45;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = local_60;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            fVar14 = expf(*(float *)(*pauVar7 + lVar8 * 4));
            *(float *)(*pauVar7 + lVar8 * 4) = fVar14;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 8:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_60 = uVar5 & 0xfffffffc;
      lVar6 = 0;
      do {
        auVar54 = _DAT_00555350;
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            auVar24 = maxps(*pauVar7,auVar54);
            fVar14 = (float)(auVar24._0_4_ & 0x807fffff | 0x3f000000);
            fVar40 = (float)(auVar24._4_4_ & 0x807fffff | 0x3f000000);
            fVar41 = (float)(auVar24._8_4_ & 0x807fffff | 0x3f000000);
            fVar42 = (float)(auVar24._12_4_ & 0x807fffff | 0x3f000000);
            fVar13 = fVar14 + -1.0 + (float)(-(uint)(fVar14 < 0.70710677) & (uint)fVar14);
            fVar26 = fVar40 + -1.0 + (float)(-(uint)(fVar40 < 0.70710677) & (uint)fVar40);
            fVar27 = fVar41 + -1.0 + (float)(-(uint)(fVar41 < 0.70710677) & (uint)fVar41);
            fVar30 = fVar42 + -1.0 + (float)(-(uint)(fVar42 < 0.70710677) & (uint)fVar42);
            auVar39._0_4_ =
                 ((float)(int)((auVar24._0_4_ >> 0x17) - 0x7e) -
                 (float)(-(uint)(fVar14 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar13 +
                 (((((((((fVar13 * 0.070376836 + -0.1151461) * fVar13 + 0.116769984) * fVar13 +
                       -0.12420141) * fVar13 + 0.14249323) * fVar13 + -0.16668057) * fVar13 +
                    0.20000714) * fVar13 + -0.24999994) * fVar13 + 0.3333333) * fVar13 + -0.5) *
                 fVar13 * fVar13;
            auVar39._4_4_ =
                 ((float)(int)((auVar24._4_4_ >> 0x17) - 0x7e) -
                 (float)(-(uint)(fVar40 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar26 +
                 (((((((((fVar26 * 0.070376836 + -0.1151461) * fVar26 + 0.116769984) * fVar26 +
                       -0.12420141) * fVar26 + 0.14249323) * fVar26 + -0.16668057) * fVar26 +
                    0.20000714) * fVar26 + -0.24999994) * fVar26 + 0.3333333) * fVar26 + -0.5) *
                 fVar26 * fVar26;
            auVar39._8_4_ =
                 ((float)(int)((auVar24._8_4_ >> 0x17) - 0x7e) -
                 (float)(-(uint)(fVar41 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar27 +
                 (((((((((fVar27 * 0.070376836 + -0.1151461) * fVar27 + 0.116769984) * fVar27 +
                       -0.12420141) * fVar27 + 0.14249323) * fVar27 + -0.16668057) * fVar27 +
                    0.20000714) * fVar27 + -0.24999994) * fVar27 + 0.3333333) * fVar27 + -0.5) *
                 fVar27 * fVar27;
            auVar39._12_4_ =
                 ((float)(int)((auVar24._12_4_ >> 0x17) - 0x7e) -
                 (float)(-(uint)(fVar42 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar30 +
                 (((((((((fVar30 * 0.070376836 + -0.1151461) * fVar30 + 0.116769984) * fVar30 +
                       -0.12420141) * fVar30 + 0.14249323) * fVar30 + -0.16668057) * fVar30 +
                    0.20000714) * fVar30 + -0.24999994) * fVar30 + 0.3333333) * fVar30 + -0.5) *
                 fVar30 * fVar30;
            *pauVar7 = auVar39;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = local_60;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            fVar14 = logf(*(float *)(*pauVar7 + lVar8 * 4));
            *(float *)(*pauVar7 + lVar8 * 4) = fVar14;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 9:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_60 = uVar5 & 0xfffffffc;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            fVar14 = *(float *)((long)*pauVar7 + 4);
            fVar13 = *(float *)((long)*pauVar7 + 8);
            fVar40 = *(float *)((long)*pauVar7 + 0xc);
            fVar26 = ABS(*(float *)*pauVar7);
            fVar41 = ABS(fVar14);
            fVar27 = ABS(fVar13);
            fVar42 = ABS(fVar40);
            uVar9 = (int)(fVar26 * 1.2732395) + 1;
            uVar11 = (int)(fVar41 * 1.2732395) + 1;
            uVar28 = (int)(fVar27 * 1.2732395) + 1;
            uVar31 = (int)(fVar42 * 1.2732395) + 1;
            fVar26 = (float)(int)(uVar9 & 0xfffffffe) * -0.7853982 + fVar26;
            fVar41 = (float)(int)(uVar11 & 0xfffffffe) * -0.7853982 + fVar41;
            fVar27 = (float)(int)(uVar28 & 0xfffffffe) * -0.7853982 + fVar27;
            fVar42 = (float)(int)(uVar31 & 0xfffffffe) * -0.7853982 + fVar42;
            fVar30 = fVar26 * fVar26;
            fVar59 = fVar41 * fVar41;
            fVar61 = fVar27 * fVar27;
            fVar63 = fVar42 * fVar42;
            uVar10 = -(uint)((uVar9 & 2) == 0);
            uVar12 = -(uint)((uVar11 & 2) == 0);
            uVar29 = -(uint)((uVar28 & 2) == 0);
            uVar32 = -(uint)((uVar31 & 2) == 0);
            auVar50._0_4_ =
                 (uint)(fVar30 * fVar26 *
                        ((fVar30 * -0.00019515296 + 0.008332161) * fVar30 + -0.16666655) + fVar26) &
                 uVar10;
            auVar50._4_4_ =
                 (uint)(fVar59 * fVar41 *
                        ((fVar59 * -0.00019515296 + 0.008332161) * fVar59 + -0.16666655) + fVar41) &
                 uVar12;
            auVar50._8_4_ =
                 (uint)(fVar61 * fVar27 *
                        ((fVar61 * -0.00019515296 + 0.008332161) * fVar61 + -0.16666655) + fVar27) &
                 uVar29;
            auVar50._12_4_ =
                 (uint)(fVar63 * fVar42 *
                        ((fVar63 * -0.00019515296 + 0.008332161) * fVar63 + -0.16666655) + fVar42) &
                 uVar32;
            auVar22._0_4_ =
                 ~uVar10 & (uint)((((fVar30 * 2.4433157e-05 + -0.0013887316) * fVar30 + 0.041666646)
                                   * fVar30 + -0.5) * fVar30 + 1.0);
            auVar22._4_4_ =
                 ~uVar12 & (uint)((((fVar59 * 2.4433157e-05 + -0.0013887316) * fVar59 + 0.041666646)
                                   * fVar59 + -0.5) * fVar59 + 1.0);
            auVar22._8_4_ =
                 ~uVar29 & (uint)((((fVar61 * 2.4433157e-05 + -0.0013887316) * fVar61 + 0.041666646)
                                   * fVar61 + -0.5) * fVar61 + 1.0);
            auVar22._12_4_ =
                 ~uVar32 & (uint)((((fVar63 * 2.4433157e-05 + -0.0013887316) * fVar63 + 0.041666646)
                                   * fVar63 + -0.5) * fVar63 + 1.0);
            auVar22 = auVar22 | auVar50;
            auVar23._0_4_ =
                 auVar22._0_4_ ^ (uVar9 * 0x20000000 ^ (uint)*(float *)*pauVar7) & 0x80000000;
            auVar23._4_4_ = auVar22._4_4_ ^ (uVar11 * 0x20000000 ^ (uint)fVar14) & 0x80000000;
            auVar23._8_4_ = auVar22._8_4_ ^ (uVar28 * 0x20000000 ^ (uint)fVar13) & 0x80000000;
            auVar23._12_4_ = auVar22._12_4_ ^ (uVar31 * 0x20000000 ^ (uint)fVar40) & 0x80000000;
            *pauVar7 = auVar23;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = local_60;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            fVar14 = sinf(*(float *)((long)*pauVar7 + lVar8 * 4));
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar14;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 10:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_60 = uVar5 & 0xfffffffc;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            fVar13 = ABS(*(float *)((long)*pauVar7 + 4));
            fVar40 = ABS(*(float *)((long)*pauVar7 + 8));
            fVar26 = ABS(*(float *)((long)*pauVar7 + 0xc));
            uVar9 = (int)(ABS(*(float *)*pauVar7) * 1.2732395) + 1U & 0xfffffffe;
            uVar11 = (int)(fVar13 * 1.2732395) + 1U & 0xfffffffe;
            uVar28 = (int)(fVar40 * 1.2732395) + 1U & 0xfffffffe;
            uVar31 = (int)(fVar26 * 1.2732395) + 1U & 0xfffffffe;
            fVar14 = (float)(int)uVar9 * -0.7853982 + ABS(*(float *)*pauVar7);
            fVar13 = (float)(int)uVar11 * -0.7853982 + fVar13;
            fVar40 = (float)(int)uVar28 * -0.7853982 + fVar40;
            fVar26 = (float)(int)uVar31 * -0.7853982 + fVar26;
            fVar41 = fVar14 * fVar14;
            fVar27 = fVar13 * fVar13;
            fVar42 = fVar40 * fVar40;
            fVar30 = fVar26 * fVar26;
            uVar9 = uVar9 - 2;
            uVar11 = uVar11 - 2;
            uVar28 = uVar28 - 2;
            uVar31 = uVar31 - 2;
            uVar10 = -(uint)((uVar9 & 2) == 0);
            uVar12 = -(uint)((uVar11 & 2) == 0);
            uVar29 = -(uint)((uVar28 & 2) == 0);
            uVar32 = -(uint)((uVar31 & 2) == 0);
            auVar46._0_4_ =
                 (uint)(fVar41 * fVar14 *
                        ((fVar41 * -0.00019515296 + 0.008332161) * fVar41 + -0.16666655) + fVar14) &
                 uVar10;
            auVar46._4_4_ =
                 (uint)(fVar27 * fVar13 *
                        ((fVar27 * -0.00019515296 + 0.008332161) * fVar27 + -0.16666655) + fVar13) &
                 uVar12;
            auVar46._8_4_ =
                 (uint)(fVar42 * fVar40 *
                        ((fVar42 * -0.00019515296 + 0.008332161) * fVar42 + -0.16666655) + fVar40) &
                 uVar29;
            auVar46._12_4_ =
                 (uint)(fVar30 * fVar26 *
                        ((fVar30 * -0.00019515296 + 0.008332161) * fVar30 + -0.16666655) + fVar26) &
                 uVar32;
            auVar25._0_4_ =
                 ~uVar10 & (uint)((((fVar41 * 2.4433157e-05 + -0.0013887316) * fVar41 + 0.041666646)
                                   * fVar41 + -0.5) * fVar41 + 1.0);
            auVar25._4_4_ =
                 ~uVar12 & (uint)((((fVar27 * 2.4433157e-05 + -0.0013887316) * fVar27 + 0.041666646)
                                   * fVar27 + -0.5) * fVar27 + 1.0);
            auVar25._8_4_ =
                 ~uVar29 & (uint)((((fVar42 * 2.4433157e-05 + -0.0013887316) * fVar42 + 0.041666646)
                                   * fVar42 + -0.5) * fVar42 + 1.0);
            auVar25._12_4_ =
                 ~uVar32 & (uint)((((fVar30 * 2.4433157e-05 + -0.0013887316) * fVar30 + 0.041666646)
                                   * fVar30 + -0.5) * fVar30 + 1.0);
            auVar38._0_4_ = uVar9 * 0x20000000;
            auVar38._4_4_ = uVar11 * 0x20000000;
            auVar38._8_4_ = uVar28 * 0x20000000;
            auVar38._12_4_ = uVar31 * 0x20000000;
            *pauVar7 = auVar38 & _DAT_00552240 ^ _DAT_00552240 ^ (auVar25 | auVar46);
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = local_60;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            fVar14 = cosf(*(float *)((long)*pauVar7 + lVar8 * 4));
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar14;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 0xb:
    local_50 = (long)bottom_top_blob->c;
    if (0 < local_50) {
      iVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if (iVar4 < 4) {
          iVar1 = 0;
        }
        else {
          iVar2 = 0;
          do {
            local_48 = *(float (*) [2])*pauVar7;
            afStack_40._0_8_ = *(undefined8 *)((long)*pauVar7 + 8);
            afVar70 = UnaryOp_x86_functor::unary_op_tan::func_pack4(&local_51,(__m128 *)local_48);
            auVar19._0_8_ = afVar70._0_8_;
            auVar19._8_8_ = extraout_XMM0_Qb;
            *pauVar7 = auVar19;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar2 + 4;
            iVar3 = iVar2 + 7;
            iVar2 = iVar1;
          } while (iVar3 < iVar4);
        }
        if (iVar4 - iVar1 != 0 && iVar1 <= iVar4) {
          lVar8 = 0;
          do {
            fVar14 = tanf(*(float *)((long)*pauVar7 + lVar8 * 4));
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar14;
            lVar8 = lVar8 + 1;
          } while (iVar4 - iVar1 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != local_50);
    }
    break;
  case 0xc:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_60 = uVar5 & 0xfffffffc;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            fVar14 = *(float *)((long)*pauVar7 + 8);
            fVar13 = *(float *)((long)*pauVar7 + 0xc);
            fVar42 = ABS(*(float *)*pauVar7);
            fVar30 = ABS(*(float *)((long)*pauVar7 + 4));
            fVar61 = ABS(fVar14);
            fVar65 = ABS(fVar13);
            uVar9 = -(uint)(0.5 < fVar42);
            uVar10 = -(uint)(0.5 < fVar30);
            uVar11 = -(uint)(0.5 < fVar61);
            uVar12 = -(uint)(0.5 < fVar65);
            fVar40 = (float)(uVar9 & 0x3f800000);
            fVar26 = (float)(uVar10 & 0x3f800000);
            fVar41 = (float)(uVar11 & 0x3f800000);
            fVar27 = (float)(uVar12 & 0x3f800000);
            auVar57._0_4_ = fVar42 * 0.5;
            auVar57._4_4_ = fVar30 * 0.5;
            auVar57._8_4_ = fVar61 * 0.5;
            auVar57._12_4_ = fVar65 * 0.5;
            auVar64._0_4_ = 0.5 - auVar57._0_4_;
            auVar64._4_4_ = 0.5 - auVar57._4_4_;
            auVar64._8_4_ = 0.5 - auVar57._8_4_;
            auVar64._12_4_ = 0.5 - auVar57._12_4_;
            auVar54 = rsqrtps(auVar57,auVar64);
            fVar59 = auVar64._0_4_ * auVar54._0_4_;
            fVar63 = auVar64._4_4_ * auVar54._4_4_;
            fVar66 = auVar64._8_4_ * auVar54._8_4_;
            fVar68 = auVar64._12_4_ * auVar54._12_4_;
            fVar42 = (float)(~uVar9 & (uint)fVar42 |
                            -(uint)(1.1754944e-38 <= ABS(auVar64._0_4_) && 0.5 < fVar42) &
                            (uint)(fVar59 * -0.5 * (auVar54._0_4_ * fVar59 + -3.0)));
            fVar59 = (float)(~uVar10 & (uint)fVar30 |
                            -(uint)(1.1754944e-38 <= ABS(auVar64._4_4_) && 0.5 < fVar30) &
                            (uint)(fVar63 * -0.5 * (auVar54._4_4_ * fVar63 + -3.0)));
            fVar63 = (float)(~uVar11 & (uint)fVar61 |
                            -(uint)(1.1754944e-38 <= ABS(auVar64._8_4_) && 0.5 < fVar61) &
                            (uint)(fVar66 * -0.5 * (auVar54._8_4_ * fVar66 + -3.0)));
            fVar66 = (float)(~uVar12 & (uint)fVar65 |
                            -(uint)(1.1754944e-38 <= ABS(auVar64._12_4_) && 0.5 < fVar65) &
                            (uint)(fVar68 * -0.5 * (auVar54._12_4_ * fVar68 + -3.0)));
            fVar30 = fVar42 * fVar42;
            fVar61 = fVar59 * fVar59;
            fVar65 = fVar63 * fVar63;
            fVar68 = fVar66 * fVar66;
            fVar67 = fVar30 * fVar30;
            fVar69 = fVar61 * fVar61;
            fVar60 = fVar65 * fVar65;
            fVar62 = fVar68 * fVar68;
            auVar49._0_4_ =
                 (fVar40 * -3.0 + 1.0) * fVar42 *
                 (((fVar67 * 0.042417344 + 0.045520633) * fVar67 + 0.16666782) * fVar30 +
                 (fVar67 * 0.023994016 + 0.07494697) * fVar67 + 1.0) + fVar40 * 1.5707964;
            auVar49._4_4_ =
                 (fVar26 * -3.0 + 1.0) * fVar59 *
                 (((fVar69 * 0.042417344 + 0.045520633) * fVar69 + 0.16666782) * fVar61 +
                 (fVar69 * 0.023994016 + 0.07494697) * fVar69 + 1.0) + fVar26 * 1.5707964;
            auVar49._8_4_ =
                 (fVar41 * -3.0 + 1.0) * fVar63 *
                 (((fVar60 * 0.042417344 + 0.045520633) * fVar60 + 0.16666782) * fVar65 +
                 (fVar60 * 0.023994016 + 0.07494697) * fVar60 + 1.0) + fVar41 * 1.5707964;
            auVar49._12_4_ =
                 (fVar27 * -3.0 + 1.0) * fVar66 *
                 (((fVar62 * 0.042417344 + 0.045520633) * fVar62 + 0.16666782) * fVar68 +
                 (fVar62 * 0.023994016 + 0.07494697) * fVar62 + 1.0) + fVar27 * 1.5707964;
            auVar21._0_8_ = *(ulong *)*pauVar7 & 0x8000000080000000;
            auVar21._8_4_ = (uint)fVar14 & 0x80000000;
            auVar21._12_4_ = (uint)fVar13 & 0x80000000;
            *pauVar7 = auVar49 | auVar21;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = local_60;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            fVar14 = asinf(*(float *)((long)*pauVar7 + lVar8 * 4));
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar14;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 0xd:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_60 = uVar5 & 0xfffffffc;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            fVar14 = *(float *)*pauVar7;
            fVar13 = *(float *)((long)*pauVar7 + 4);
            fVar40 = *(float *)((long)*pauVar7 + 8);
            fVar26 = *(float *)((long)*pauVar7 + 0xc);
            fVar41 = ABS(fVar14);
            fVar27 = ABS(fVar13);
            fVar42 = ABS(fVar40);
            fVar30 = ABS(fVar26);
            uVar9 = -(uint)(0.5 < fVar41);
            uVar10 = -(uint)(0.5 < fVar27);
            uVar11 = -(uint)(0.5 < fVar42);
            uVar12 = -(uint)(0.5 < fVar30);
            auVar53._0_4_ = fVar41 * 0.5;
            auVar53._4_4_ = fVar27 * 0.5;
            auVar53._8_4_ = fVar42 * 0.5;
            auVar53._12_4_ = fVar30 * 0.5;
            auVar58._0_4_ = 0.5 - auVar53._0_4_;
            auVar58._4_4_ = 0.5 - auVar53._4_4_;
            auVar58._8_4_ = 0.5 - auVar53._8_4_;
            auVar58._12_4_ = 0.5 - auVar53._12_4_;
            auVar54 = rsqrtps(auVar53,auVar58);
            fVar59 = auVar58._0_4_ * auVar54._0_4_;
            fVar61 = auVar58._4_4_ * auVar54._4_4_;
            fVar63 = auVar58._8_4_ * auVar54._8_4_;
            fVar65 = auVar58._12_4_ * auVar54._12_4_;
            fVar41 = (float)(~uVar9 & (uint)fVar41 |
                            -(uint)(1.1754944e-38 <= ABS(auVar58._0_4_) && 0.5 < fVar41) &
                            (uint)((fVar59 * auVar54._0_4_ + -3.0) * fVar59 * -0.5));
            fVar27 = (float)(~uVar10 & (uint)fVar27 |
                            -(uint)(1.1754944e-38 <= ABS(auVar58._4_4_) && 0.5 < fVar27) &
                            (uint)((fVar61 * auVar54._4_4_ + -3.0) * fVar61 * -0.5));
            fVar42 = (float)(~uVar11 & (uint)fVar42 |
                            -(uint)(1.1754944e-38 <= ABS(auVar58._8_4_) && 0.5 < fVar42) &
                            (uint)((fVar63 * auVar54._8_4_ + -3.0) * fVar63 * -0.5));
            fVar30 = (float)(~uVar12 & (uint)fVar30 |
                            -(uint)(1.1754944e-38 <= ABS(auVar58._12_4_) && 0.5 < fVar30) &
                            (uint)((fVar65 * auVar54._12_4_ + -3.0) * fVar65 * -0.5));
            fVar59 = fVar41 * fVar41;
            fVar61 = fVar27 * fVar27;
            fVar63 = fVar42 * fVar42;
            fVar65 = fVar30 * fVar30;
            fVar66 = fVar59 * fVar59;
            fVar68 = fVar61 * fVar61;
            fVar67 = fVar63 * fVar63;
            fVar69 = fVar65 * fVar65;
            fVar41 = (((fVar66 * 0.042417344 + 0.045520633) * fVar66 + 0.16666782) * fVar59 +
                     (fVar66 * 0.023994016 + 0.07494697) * fVar66 + 1.0) * fVar41;
            fVar27 = (((fVar68 * 0.042417344 + 0.045520633) * fVar68 + 0.16666782) * fVar61 +
                     (fVar68 * 0.023994016 + 0.07494697) * fVar68 + 1.0) * fVar27;
            fVar42 = (((fVar67 * 0.042417344 + 0.045520633) * fVar67 + 0.16666782) * fVar63 +
                     (fVar67 * 0.023994016 + 0.07494697) * fVar67 + 1.0) * fVar42;
            fVar30 = (((fVar69 * 0.042417344 + 0.045520633) * fVar69 + 0.16666782) * fVar65 +
                     (fVar69 * 0.023994016 + 0.07494697) * fVar69 + 1.0) * fVar30;
            auVar55._0_4_ =
                 (uint)((float)((uint)(fVar41 + fVar41) | (uint)fVar14 & 0x80000000) +
                       (float)(-(uint)(fVar14 < 0.0) & 0x40490fdb)) & uVar9;
            auVar55._4_4_ =
                 (uint)((float)((uint)(fVar27 + fVar27) | (uint)fVar13 & 0x80000000) +
                       (float)(-(uint)(fVar13 < 0.0) & 0x40490fdb)) & uVar10;
            auVar55._8_4_ =
                 (uint)((float)((uint)(fVar42 + fVar42) | (uint)fVar40 & 0x80000000) +
                       (float)(-(uint)(fVar40 < 0.0) & 0x40490fdb)) & uVar11;
            auVar55._12_4_ =
                 (uint)((float)((uint)(fVar30 + fVar30) | (uint)fVar26 & 0x80000000) +
                       (float)(-(uint)(fVar26 < 0.0) & 0x40490fdb)) & uVar12;
            auVar54._0_4_ =
                 ~uVar9 & (uint)(1.5707964 - (float)((uint)fVar14 & 0x80000000 | (uint)fVar41));
            auVar54._4_4_ =
                 ~uVar10 & (uint)(1.5707964 - (float)((uint)fVar13 & 0x80000000 | (uint)fVar27));
            auVar54._8_4_ =
                 ~uVar11 & (uint)(1.5707964 - (float)((uint)fVar40 & 0x80000000 | (uint)fVar42));
            auVar54._12_4_ =
                 ~uVar12 & (uint)(1.5707964 - (float)((uint)fVar26 & 0x80000000 | (uint)fVar30));
            *pauVar7 = auVar54 | auVar55;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = local_60;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            fVar14 = acosf(*(float *)((long)*pauVar7 + lVar8 * 4));
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar14;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 0xe:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_60 = uVar5 & 0xfffffffc;
      lVar6 = 0;
      do {
        auVar54 = _DAT_005552e0;
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            fVar14 = *(float *)((long)*pauVar7 + 8);
            fVar13 = *(float *)((long)*pauVar7 + 0xc);
            fVar40 = ABS(*(float *)((long)*pauVar7 + 4));
            auVar48._0_8_ = *(ulong *)*pauVar7 & 0x7fffffff7fffffff;
            auVar48._8_4_ = ABS(fVar14);
            auVar48._12_4_ = ABS(fVar13);
            uVar9 = -(uint)(auVar54._0_4_ < ABS(*(float *)*pauVar7));
            uVar10 = -(uint)(auVar54._4_4_ < fVar40);
            uVar11 = -(uint)(auVar54._8_4_ < auVar48._8_4_);
            uVar12 = -(uint)(auVar54._12_4_ < auVar48._12_4_);
            auVar56._0_4_ = ~uVar9 & (uint)ABS(*(float *)*pauVar7);
            auVar56._4_4_ = ~uVar10 & (uint)fVar40;
            auVar56._8_4_ = ~uVar11 & (uint)auVar48._8_4_;
            auVar56._12_4_ = ~uVar12 & (uint)auVar48._12_4_;
            auVar44._0_8_ = CONCAT44(uVar10,uVar9) & 0xbf800000bf800000;
            auVar44._8_4_ = uVar11 & 0xbf800000;
            auVar44._12_4_ = uVar12 & 0xbf800000;
            auVar44 = auVar44 | auVar56;
            auVar24 = maxps(auVar48,auVar54);
            auVar16 = rcpps(auVar56,auVar24);
            fVar40 = auVar44._0_4_ * auVar16._0_4_;
            fVar26 = auVar44._4_4_ * auVar16._4_4_;
            fVar41 = auVar44._8_4_ * auVar16._8_4_;
            fVar27 = auVar44._12_4_ * auVar16._12_4_;
            fVar40 = (auVar44._0_4_ - auVar24._0_4_ * fVar40) * auVar16._0_4_ + fVar40;
            fVar26 = (auVar44._4_4_ - auVar24._4_4_ * fVar26) * auVar16._4_4_ + fVar26;
            fVar41 = (auVar44._8_4_ - auVar24._8_4_ * fVar41) * auVar16._8_4_ + fVar41;
            fVar27 = (auVar44._12_4_ - auVar24._12_4_ * fVar27) * auVar16._12_4_ + fVar27;
            fVar42 = fVar40 * fVar40;
            fVar30 = fVar26 * fVar26;
            fVar59 = fVar41 * fVar41;
            fVar61 = fVar27 * fVar27;
            fVar63 = fVar42 * fVar42;
            fVar65 = fVar30 * fVar30;
            fVar66 = fVar59 * fVar59;
            fVar68 = fVar61 * fVar61;
            auVar34._0_4_ =
                 (float)(uVar9 & 0x3fc90fdb) +
                 ((((fVar63 * -0.01606863 + -0.07504295) * fVar63 + -0.14203644) * fVar63 +
                  -0.33333072) * fVar42 +
                 (((fVar63 * 0.0028498897 + 0.04269152) * fVar63 + 0.10640934) * fVar63 + 0.1999262)
                 * fVar63 + auVar54._0_4_) * fVar40;
            auVar34._4_4_ =
                 (float)(uVar10 & 0x3fc90fdb) +
                 ((((fVar65 * -0.01606863 + -0.07504295) * fVar65 + -0.14203644) * fVar65 +
                  -0.33333072) * fVar30 +
                 (((fVar65 * 0.0028498897 + 0.04269152) * fVar65 + 0.10640934) * fVar65 + 0.1999262)
                 * fVar65 + auVar54._4_4_) * fVar26;
            auVar34._8_4_ =
                 (float)(uVar11 & 0x3fc90fdb) +
                 ((((fVar66 * -0.01606863 + -0.07504295) * fVar66 + -0.14203644) * fVar66 +
                  -0.33333072) * fVar59 +
                 (((fVar66 * 0.0028498897 + 0.04269152) * fVar66 + 0.10640934) * fVar66 + 0.1999262)
                 * fVar66 + auVar54._8_4_) * fVar41;
            auVar34._12_4_ =
                 (float)(uVar12 & 0x3fc90fdb) +
                 ((((fVar68 * -0.01606863 + -0.07504295) * fVar68 + -0.14203644) * fVar68 +
                  -0.33333072) * fVar61 +
                 (((fVar68 * 0.0028498897 + 0.04269152) * fVar68 + 0.10640934) * fVar68 + 0.1999262)
                 * fVar68 + auVar54._12_4_) * fVar27;
            auVar18._0_8_ = *(ulong *)*pauVar7 & 0x8000000080000000;
            auVar18._8_4_ = (uint)fVar14 & 0x80000000;
            auVar18._12_4_ = (uint)fVar13 & 0x80000000;
            *pauVar7 = auVar34 | auVar18;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = local_60;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            fVar14 = atanf(*(float *)((long)*pauVar7 + lVar8 * 4));
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar14;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 0xf:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            auVar54 = *pauVar7;
            in_XMM3 = rcpps(in_XMM3,auVar54);
            fVar14 = in_XMM3._0_4_;
            fVar13 = in_XMM3._4_4_;
            fVar40 = in_XMM3._8_4_;
            fVar26 = in_XMM3._12_4_;
            *(float *)*pauVar7 = (1.0 - auVar54._0_4_ * fVar14) * fVar14 + fVar14;
            *(float *)(*pauVar7 + 4) = (1.0 - auVar54._4_4_ * fVar13) * fVar13 + fVar13;
            *(float *)(*pauVar7 + 8) = (1.0 - auVar54._8_4_ * fVar40) * fVar40 + fVar40;
            *(float *)(*pauVar7 + 0xc) = (1.0 - auVar54._12_4_ * fVar26) * fVar26 + fVar26;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            *(float *)(*pauVar7 + lVar8 * 4) = 1.0 / *(float *)(*pauVar7 + lVar8 * 4);
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 0x10:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_60 = uVar5 & 0xfffffffc;
      lVar6 = 0;
      do {
        auVar54 = _DAT_005552a0;
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            auVar15._0_4_ = *(float *)*pauVar7 * -2.0;
            auVar15._4_4_ = *(float *)((long)*pauVar7 + 4) * -2.0;
            auVar15._8_4_ = *(float *)((long)*pauVar7 + 8) * -2.0;
            auVar15._12_4_ = *(float *)((long)*pauVar7 + 0xc) * -2.0;
            auVar16 = minps(auVar15,auVar54);
            auVar24._8_4_ = 0xc2b0c0a5;
            auVar24._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar24._12_4_ = 0xc2b0c0a5;
            auVar24 = maxps(auVar16,auVar24);
            fVar13 = auVar24._0_4_ * 1.442695 + 0.5;
            fVar26 = auVar24._4_4_ * 1.442695 + 0.5;
            fVar27 = auVar24._8_4_ * 1.442695 + 0.5;
            fVar30 = auVar24._12_4_ * 1.442695 + 0.5;
            fVar14 = (float)(int)fVar13;
            fVar40 = (float)(int)fVar26;
            fVar41 = (float)(int)fVar27;
            fVar42 = (float)(int)fVar30;
            fVar14 = fVar14 - (float)(-(uint)(fVar13 < fVar14) & 0x3f800000);
            fVar40 = fVar40 - (float)(-(uint)(fVar26 < fVar40) & 0x3f800000);
            fVar41 = fVar41 - (float)(-(uint)(fVar27 < fVar41) & 0x3f800000);
            fVar42 = fVar42 - (float)(-(uint)(fVar30 < fVar42) & 0x3f800000);
            fVar13 = fVar14 * -0.6931472 + auVar24._0_4_;
            fVar26 = fVar40 * -0.6931472 + auVar24._4_4_;
            fVar27 = fVar41 * -0.6931472 + auVar24._8_4_;
            fVar30 = fVar42 * -0.6931472 + auVar24._12_4_;
            auVar17._0_4_ = fVar13 * fVar13;
            auVar17._4_4_ = fVar26 * fVar26;
            auVar17._8_4_ = fVar27 * fVar27;
            auVar17._12_4_ = fVar30 * fVar30;
            auVar43._0_4_ =
                 (float)((int)fVar14 * 0x800000 + 0x3f800000) *
                 (fVar13 + 1.0 +
                 (((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) * fVar13 +
                   0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5) * auVar17._0_4_) + 1.0;
            auVar43._4_4_ =
                 (float)((int)fVar40 * 0x800000 + 0x3f800000) *
                 (fVar26 + 1.0 +
                 (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                   0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5) * auVar17._4_4_) + 1.0;
            auVar43._8_4_ =
                 (float)((int)fVar41 * 0x800000 + 0x3f800000) *
                 (fVar27 + 1.0 +
                 (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                   0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5) * auVar17._8_4_) + 1.0;
            auVar43._12_4_ =
                 (float)((int)fVar42 * 0x800000 + 0x3f800000) *
                 (fVar30 + 1.0 +
                 (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
                   0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5) * auVar17._12_4_) + 1.0;
            auVar24 = rcpps(auVar17,auVar43);
            fVar14 = auVar24._0_4_;
            fVar13 = auVar24._4_4_;
            fVar40 = auVar24._8_4_;
            fVar26 = auVar24._12_4_;
            auVar47._0_4_ =
                 (2.0 - auVar43._0_4_ * (fVar14 + fVar14)) * fVar14 + fVar14 + fVar14 + -1.0;
            auVar47._4_4_ =
                 (2.0 - auVar43._4_4_ * (fVar13 + fVar13)) * fVar13 + fVar13 + fVar13 + -1.0;
            auVar47._8_4_ =
                 (2.0 - auVar43._8_4_ * (fVar40 + fVar40)) * fVar40 + fVar40 + fVar40 + -1.0;
            auVar47._12_4_ =
                 (2.0 - auVar43._12_4_ * (fVar26 + fVar26)) * fVar26 + fVar26 + fVar26 + -1.0;
            *pauVar7 = auVar47;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = local_60;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            fVar14 = tanhf(*(float *)((long)*pauVar7 + lVar8 * 4));
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar14;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
    break;
  case 0x11:
    iVar4 = bottom_top_blob->c;
    if (0 < (long)iVar4) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_60 = uVar5 & 0xfffffffc;
      lVar6 = 0;
      do {
        auVar54 = _DAT_00555350;
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar1 = 3;
          do {
            auVar24 = maxps(*pauVar7,auVar54);
            fVar14 = (float)(auVar24._0_4_ & 0x807fffff | 0x3f000000);
            fVar40 = (float)(auVar24._4_4_ & 0x807fffff | 0x3f000000);
            fVar41 = (float)(auVar24._8_4_ & 0x807fffff | 0x3f000000);
            fVar42 = (float)(auVar24._12_4_ & 0x807fffff | 0x3f000000);
            fVar13 = fVar14 + -1.0 + (float)(-(uint)(fVar14 < 0.70710677) & (uint)fVar14);
            fVar26 = fVar40 + -1.0 + (float)(-(uint)(fVar40 < 0.70710677) & (uint)fVar40);
            fVar27 = fVar41 + -1.0 + (float)(-(uint)(fVar41 < 0.70710677) & (uint)fVar41);
            fVar30 = fVar42 + -1.0 + (float)(-(uint)(fVar42 < 0.70710677) & (uint)fVar42);
            auVar16._0_4_ =
                 (((float)(int)((auVar24._0_4_ >> 0x17) - 0x7e) -
                  (float)(-(uint)(fVar14 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar13 +
                 (((((((((fVar13 * 0.070376836 + -0.1151461) * fVar13 + 0.116769984) * fVar13 +
                       -0.12420141) * fVar13 + 0.14249323) * fVar13 + -0.16668057) * fVar13 +
                    0.20000714) * fVar13 + -0.24999994) * fVar13 + 0.3333333) * fVar13 + -0.5) *
                 fVar13 * fVar13) * 0.4342945;
            auVar16._4_4_ =
                 (((float)(int)((auVar24._4_4_ >> 0x17) - 0x7e) -
                  (float)(-(uint)(fVar40 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar26 +
                 (((((((((fVar26 * 0.070376836 + -0.1151461) * fVar26 + 0.116769984) * fVar26 +
                       -0.12420141) * fVar26 + 0.14249323) * fVar26 + -0.16668057) * fVar26 +
                    0.20000714) * fVar26 + -0.24999994) * fVar26 + 0.3333333) * fVar26 + -0.5) *
                 fVar26 * fVar26) * 0.4342945;
            auVar16._8_4_ =
                 (((float)(int)((auVar24._8_4_ >> 0x17) - 0x7e) -
                  (float)(-(uint)(fVar41 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar27 +
                 (((((((((fVar27 * 0.070376836 + -0.1151461) * fVar27 + 0.116769984) * fVar27 +
                       -0.12420141) * fVar27 + 0.14249323) * fVar27 + -0.16668057) * fVar27 +
                    0.20000714) * fVar27 + -0.24999994) * fVar27 + 0.3333333) * fVar27 + -0.5) *
                 fVar27 * fVar27) * 0.4342945;
            auVar16._12_4_ =
                 (((float)(int)((auVar24._12_4_ >> 0x17) - 0x7e) -
                  (float)(-(uint)(fVar42 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar30 +
                 (((((((((fVar30 * 0.070376836 + -0.1151461) * fVar30 + 0.116769984) * fVar30 +
                       -0.12420141) * fVar30 + 0.14249323) * fVar30 + -0.16668057) * fVar30 +
                    0.20000714) * fVar30 + -0.24999994) * fVar30 + 0.3333333) * fVar30 + -0.5) *
                 fVar30 * fVar30) * 0.4342945;
            *pauVar7 = auVar16;
            pauVar7 = pauVar7 + 1;
            iVar1 = iVar1 + 4;
            uVar9 = local_60;
          } while (iVar1 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar8 = 0;
          do {
            fVar14 = log10f(*(float *)(*pauVar7 + lVar8 * 4));
            *(float *)(*pauVar7 + lVar8 * 4) = fVar14;
            lVar8 = lVar8 + 1;
          } while (uVar5 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar4);
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    return 0;
}